

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,char *value)

{
  size_t in_RCX;
  void *in_RDX;
  char *in_RSI;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  char cVar1;
  cstring_spec_handler local_28 [2];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_8;
  
  if (in_RDI->specs_ == (format_specs *)0x0) {
    write(in_RDI,(int)in_RSI,in_RDX,in_RCX);
    local_8.container =
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  else {
    cVar1 = in_RDI->specs_->type;
    cstring_spec_handler::cstring_spec_handler(local_28,in_RDI,in_RSI);
    handle_cstring_type_spec<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::cstring_spec_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (cstring_spec_handler *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
    local_8.container =
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8.container;
}

Assistant:

iterator operator()(const Char* value) {
    if (!specs_) return write(value), out_;
    handle_cstring_type_spec(specs_->type, cstring_spec_handler(*this, value));
    return out_;
  }